

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

int replay_display_menu(nh_menuitem *items,int icount,char *title,int how,int *results)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  long lVar4;
  nh_menuitem *pnVar5;
  long lVar6;
  int val;
  undefined8 uStack_38;
  
  if (how == 0) {
    lVar6 = 0;
  }
  else {
    uStack_38 = in_RAX;
    pcVar3 = next_log_token();
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'm')) {
      parse_error("Bad menu data");
    }
    lVar6 = 0xffffffff;
    if (pcVar3[2] != 'x') {
      pcVar3 = pcVar3 + 3;
      lVar6 = 0;
      iVar2 = __isoc99_sscanf(pcVar3,"%x:",(long)&uStack_38 + 4);
      if (iVar2 != 0) {
        lVar6 = 0;
        do {
          if (icount < 1) {
LAB_001b9ec6:
            parse_error("Invalid menu id in menu data");
          }
          lVar4 = 1;
          pnVar5 = items;
          do {
            piVar1 = &pnVar5->id;
            if (icount <= lVar4) break;
            pnVar5 = pnVar5 + 1;
            lVar4 = lVar4 + 1;
          } while (*piVar1 != uStack_38._4_4_);
          if (*piVar1 != uStack_38._4_4_) goto LAB_001b9ec6;
          results[lVar6] = uStack_38._4_4_;
          lVar6 = lVar6 + 1;
          pcVar3 = strchr(pcVar3,0x3a);
          pcVar3 = pcVar3 + 1;
          iVar2 = __isoc99_sscanf(pcVar3,"%x:",(long)&uStack_38 + 4);
        } while (iVar2 != 0);
      }
    }
  }
  return (int)lVar6;
}

Assistant:

static int replay_display_menu(struct nh_menuitem *items, int icount,
				const char *title, int how, int *results)
{
    int i, j, val;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'm')
	parse_error("Bad menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    while (sscanf(resultbuf, "%x:", &val)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == val)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in menu data");
	
	results[i++] = val;
	resultbuf = strchr(resultbuf, ':') + 1;
    }

    return i;
}